

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

CodePointMatcherWarehouse * __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::operator=
          (CodePointMatcherWarehouse *this,CodePointMatcherWarehouse *src)

{
  CodePointMatcher **__src;
  CodePointMatcher **ppCVar1;
  long lVar2;
  
  lVar2 = 0x10;
  do {
    *(undefined4 *)((long)(this->codePoints)._M_elems + lVar2 + -8) =
         *(undefined4 *)((long)(src->codePoints)._M_elems + lVar2 + -8);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x60);
  if ((this->codePointsOverflow).needToRelease != '\0') {
    uprv_free_63((this->codePointsOverflow).ptr);
  }
  (this->codePointsOverflow).capacity = (src->codePointsOverflow).capacity;
  (this->codePointsOverflow).needToRelease = (src->codePointsOverflow).needToRelease;
  ppCVar1 = (src->codePointsOverflow).ptr;
  __src = (src->codePointsOverflow).stackArray;
  if (ppCVar1 == __src) {
    ppCVar1 = (this->codePointsOverflow).stackArray;
    (this->codePointsOverflow).ptr = ppCVar1;
    memcpy(ppCVar1,__src,(long)(src->codePointsOverflow).capacity << 3);
  }
  else {
    (this->codePointsOverflow).ptr = ppCVar1;
    (src->codePointsOverflow).ptr = __src;
    (src->codePointsOverflow).capacity = 3;
    (src->codePointsOverflow).needToRelease = '\0';
  }
  this->codePointCount = src->codePointCount;
  this->codePointNumBatches = src->codePointNumBatches;
  return this;
}

Assistant:

CodePointMatcherWarehouse&
CodePointMatcherWarehouse::operator=(CodePointMatcherWarehouse&& src) U_NOEXCEPT {
    codePoints = std::move(src.codePoints);
    codePointsOverflow = std::move(src.codePointsOverflow);
    codePointCount = src.codePointCount;
    codePointNumBatches = src.codePointNumBatches;
    return *this;
}